

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkRevoluteTranslational::IntStateGatherReactions
          (ChLinkRevoluteTranslational *this,uint off_L,ChVectorDynamic<> *L)

{
  long lVar1;
  double *pdVar2;
  int iVar3;
  
  iVar3 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar3 == '\0') {
    return;
  }
  lVar1 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)(ulong)off_L < lVar1) {
    pdVar2 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar2[off_L] = this->m_multipliers[0];
    if ((long)(ulong)(off_L + 1) < lVar1) {
      pdVar2[off_L + 1] = this->m_multipliers[1];
      if ((long)(ulong)(off_L + 2) < lVar1) {
        pdVar2[off_L + 2] = this->m_multipliers[2];
        if ((long)(ulong)(off_L + 3) < lVar1) {
          pdVar2[off_L + 3] = this->m_multipliers[3];
          return;
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChLinkRevoluteTranslational::IntStateGatherReactions(const unsigned int off_L, ChVectorDynamic<>& L) {
    if (!this->IsActive())
        return;

    L(off_L + 0) = m_multipliers[0];
    L(off_L + 1) = m_multipliers[1];
    L(off_L + 2) = m_multipliers[2];
    L(off_L + 3) = m_multipliers[3];
}